

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O2

void m256v_swap_rows(m256v *M,int r1,int r2)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (r1 != r2) {
    lVar3 = (long)r1 * M->rstride;
    lVar4 = (long)r2 * M->rstride;
    for (lVar5 = 0; (int)lVar5 < M->n_col; lVar5 = lVar5 + 1) {
      puVar2 = M->e;
      uVar1 = puVar2[lVar5 + lVar3];
      puVar2[lVar5 + lVar3] = puVar2[lVar4];
      M->e[lVar4] = uVar1;
      lVar4 = lVar4 + 1;
    }
  }
  return;
}

Assistant:

void m256v_swap_rows(m256v* M, int r1, int r2)
{
	if (r1 == r2)
		return;

	size_t o1 = get_el_offs(M, r1, 0);
	size_t o2 = get_el_offs(M, r2, 0);
	for (int i = 0; i < M->n_col; ++i) {
		const uint8_t sw = M->e[o1];
		M->e[o1] = M->e[o2];
		M->e[o2] = sw;
		++o1;
		++o2;
	}
}